

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

int cmFortranParser_Input(cmFortranParser *parser,char *buffer,size_t bufferSize)

{
  bool bVar1;
  reference pvVar2;
  size_t local_40;
  size_t n;
  FILE *file;
  cmFortranFile *ff;
  size_t bufferSize_local;
  char *buffer_local;
  cmFortranParser *parser_local;
  
  bVar1 = std::stack<cmFortranFile,_std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>_>::
          empty(&parser->FileStack);
  if (bVar1) {
    parser_local._4_4_ = 0;
  }
  else {
    pvVar2 = std::stack<cmFortranFile,_std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>_>::
             top(&parser->FileStack);
    local_40 = fread(buffer,1,bufferSize,(FILE *)pvVar2->File);
    if (local_40 == 0) {
      if ((pvVar2->LastCharWasNewline & 1U) == 0) {
        *buffer = '\n';
        local_40 = 1;
        pvVar2->LastCharWasNewline = true;
      }
    }
    else {
      pvVar2->LastCharWasNewline = buffer[local_40 - 1] == '\n';
    }
    parser_local._4_4_ = (int)local_40;
  }
  return parser_local._4_4_;
}

Assistant:

int cmFortranParser_Input(cmFortranParser* parser, char* buffer,
                          size_t bufferSize)
{
  // Read from the file on top of the stack.  If the stack is empty,
  // the end of the translation unit has been reached.
  if (!parser->FileStack.empty()) {
    cmFortranFile& ff = parser->FileStack.top();
    FILE* file = ff.File;
    size_t n = fread(buffer, 1, bufferSize, file);
    if (n > 0) {
      ff.LastCharWasNewline = buffer[n - 1] == '\n';
    } else if (!ff.LastCharWasNewline) {
      // The file ended without a newline.  Inject one so
      // that the file always ends in an end-of-statement.
      buffer[0] = '\n';
      n = 1;
      ff.LastCharWasNewline = true;
    }
    return (int)n;
  }
  return 0;
}